

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O1

void __thiscall google::protobuf::DynamicMessage::SharedCtor(DynamicMessage *this,bool lock_factory)

{
  FieldDescriptor *this_00;
  byte bVar1;
  Descriptor *pDVar2;
  DynamicMessageFactory *pDVar3;
  CppStringType CVar4;
  long lVar5;
  EnumValueDescriptor *pEVar6;
  undefined8 *puVar7;
  Descriptor *pDVar8;
  FieldDescriptor *pFVar9;
  undefined4 extraout_var;
  Message *default_entry;
  undefined4 extraout_var_00;
  Message *mapped_default_entry_if_message;
  Nonnull<const_char_*> pcVar10;
  TypeInfo *extraout_RAX;
  TypeInfo *pTVar11;
  bool bVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  code *cleanup;
  undefined7 in_register_00000031;
  DynamicMapField *this_01;
  long lVar16;
  string_view src;
  ThreadSafeArena *local_58;
  undefined1 local_50 [32];
  
  local_50._20_4_ = (int)CONCAT71(in_register_00000031,lock_factory);
  local_58 = (ThreadSafeArena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  pTVar11 = this->type_info_;
  pDVar2 = (pTVar11->class_data).descriptor;
  if (((ulong)local_58 & 1) != 0) goto LAB_002805b4;
  do {
    if (0 < pDVar2->real_oneof_decl_count_) {
      iVar13 = 0;
      iVar15 = 0;
      do {
        iVar15 = iVar15 + 1;
        *(undefined4 *)
         ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
         (long)(pTVar11->oneof_case_offset + iVar13)) = 0;
        iVar13 = iVar13 + 4;
      } while (iVar15 < pDVar2->real_oneof_decl_count_);
    }
    lVar5 = (long)pTVar11->extensions_offset;
    if (lVar5 != -1) {
      *(ThreadSafeArena **)
       ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite + lVar5) = local_58;
      *(undefined4 *)
       ((long)&(this->super_Message).super_MessageLite._internal_metadata_.ptr_ + lVar5) = 0;
      *(undefined8 *)((long)&this->type_info_ + lVar5) = 0;
    }
    if (pDVar2->field_count_ < 1) {
      return;
    }
    lVar16 = 0;
    lVar5 = 0;
    while( true ) {
      pFVar9 = pDVar2->fields_;
      if (((&pFVar9->field_0x3)[lVar16] & 1) != 0) break;
LAB_0027ffc2:
      if (9 < *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(&pFVar9->type_)[lVar16] * 4) -
              1U) goto LAB_00280222;
      this_00 = (FieldDescriptor *)(&pFVar9->super_SymbolBase + lVar16);
      this_01 = (DynamicMapField *)
                ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
                (long)(int)(this->type_info_->offsets)._M_t.
                           super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                           .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[lVar5]);
      switch(*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(&pFVar9->type_)[lVar16] * 4)) {
      case 1:
        bVar1 = (&pFVar9->field_0x1)[lVar16];
        bVar12 = (bool)((bVar1 & 0x20) >> 5);
        if (0xbf < bVar1 == bVar12) {
          pcVar10 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                              (bVar12,0xbf < bVar1,
                               "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        }
        if (pcVar10 != (Nonnull<const_char_*>)0x0) {
LAB_00280662:
          SharedCtor();
LAB_0028066f:
          SharedCtor();
LAB_0028067c:
          SharedCtor();
        }
        goto LAB_002800c4;
      case 2:
        bVar1 = (&pFVar9->field_0x1)[lVar16];
        bVar12 = (bool)((bVar1 & 0x20) >> 5);
        if (0xbf < bVar1 == bVar12) {
          pcVar10 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                              (bVar12,0xbf < bVar1,
                               "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        }
        if (pcVar10 != (Nonnull<const_char_*>)0x0) {
LAB_00280655:
          SharedCtor();
          goto LAB_00280662;
        }
        goto LAB_0028016e;
      case 3:
        bVar1 = (&pFVar9->field_0x1)[lVar16];
        bVar12 = (bool)((bVar1 & 0x20) >> 5);
        if (0xbf < bVar1 == bVar12) {
          pcVar10 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                              (bVar12,0xbf < bVar1,
                               "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        }
        if (pcVar10 != (Nonnull<const_char_*>)0x0) {
LAB_00280648:
          SharedCtor();
          goto LAB_00280655;
        }
LAB_002800c4:
        if (((&pFVar9->field_0x1)[lVar16] & 0x20) == 0) {
          *(undefined4 *)&(this_01->super_MapFieldBase).super_MapFieldBaseForParse.payload_._M_i =
               *(undefined4 *)((long)&pFVar9->field_20 + lVar16);
        }
        else {
LAB_002801fc:
          internal::ShortSooRep::ShortSooRep((ShortSooRep *)this_01,(Arena *)local_58);
          if (((this_01->super_MapFieldBase).super_MapFieldBaseForParse.payload_._M_i & 4) != 0) {
LAB_00280215:
            internal::LongSooRep::elements((LongSooRep *)this_01);
          }
        }
        break;
      case 4:
        bVar1 = (&pFVar9->field_0x1)[lVar16];
        bVar12 = (bool)((bVar1 & 0x20) >> 5);
        if (0xbf < bVar1 == bVar12) {
          pcVar10 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                              (bVar12,0xbf < bVar1,
                               "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        }
        if (pcVar10 != (Nonnull<const_char_*>)0x0) {
LAB_0028063b:
          SharedCtor();
          goto LAB_00280648;
        }
LAB_0028016e:
        if (((&pFVar9->field_0x1)[lVar16] & 0x20) == 0) {
          puVar7 = *(undefined8 **)((long)&pFVar9->field_20 + lVar16);
LAB_0028017f:
          (this_01->super_MapFieldBase).super_MapFieldBaseForParse.payload_._M_i = (TaggedPtr)puVar7
          ;
          break;
        }
        goto LAB_002801fc;
      case 5:
        bVar1 = (&pFVar9->field_0x1)[lVar16];
        bVar12 = (bool)((bVar1 & 0x20) >> 5);
        if (0xbf < bVar1 == bVar12) {
          pcVar10 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                              (bVar12,0xbf < bVar1,
                               "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        }
        if (pcVar10 != (Nonnull<const_char_*>)0x0) {
LAB_0028062e:
          SharedCtor();
          goto LAB_0028063b;
        }
        if (((&pFVar9->field_0x1)[lVar16] & 0x20) == 0) {
          (this_01->super_MapFieldBase).super_MapFieldBaseForParse.payload_._M_i =
               *(TaggedPtr *)((long)&pFVar9->field_20 + lVar16);
          break;
        }
        goto LAB_002801fc;
      case 6:
        bVar1 = (&pFVar9->field_0x1)[lVar16];
        bVar12 = (bool)((bVar1 & 0x20) >> 5);
        if (0xbf < bVar1 == bVar12) {
          pcVar10 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                              (bVar12,0xbf < bVar1,
                               "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        }
        if (pcVar10 != (Nonnull<const_char_*>)0x0) {
LAB_00280621:
          SharedCtor();
          goto LAB_0028062e;
        }
        if (((&pFVar9->field_0x1)[lVar16] & 0x20) != 0) goto LAB_002801fc;
        *(undefined4 *)&(this_01->super_MapFieldBase).super_MapFieldBaseForParse.payload_._M_i =
             *(undefined4 *)((long)&pFVar9->field_20 + lVar16);
        break;
      case 7:
        bVar1 = (&pFVar9->field_0x1)[lVar16];
        bVar12 = (bool)((bVar1 & 0x20) >> 5);
        if (0xbf < bVar1 == bVar12) {
          pcVar10 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                              (bVar12,0xbf < bVar1,
                               "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        }
        if (pcVar10 != (Nonnull<const_char_*>)0x0) {
LAB_00280614:
          SharedCtor();
          goto LAB_00280621;
        }
        if (((&pFVar9->field_0x1)[lVar16] & 0x20) != 0) goto LAB_002801fc;
        *(undefined1 *)&(this_01->super_MapFieldBase).super_MapFieldBaseForParse.payload_._M_i =
             *(undefined1 *)((long)&pFVar9->field_20 + lVar16);
        break;
      case 8:
        bVar1 = (&pFVar9->field_0x1)[lVar16];
        bVar12 = (bool)((bVar1 & 0x20) >> 5);
        if (0xbf < bVar1 == bVar12) {
          pcVar10 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                              (bVar12,0xbf < bVar1,
                               "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        }
        if (pcVar10 != (Nonnull<const_char_*>)0x0) {
LAB_00280607:
          SharedCtor();
          goto LAB_00280614;
        }
        if (((&pFVar9->field_0x1)[lVar16] & 0x20) == 0) {
          pEVar6 = FieldDescriptor::default_value_enum(this_00);
          *(int *)&(this_01->super_MapFieldBase).super_MapFieldBaseForParse.payload_._M_i =
               pEVar6->number_;
          break;
        }
        internal::ShortSooRep::ShortSooRep((ShortSooRep *)this_01,(Arena *)local_58);
        if (((this_01->super_MapFieldBase).super_MapFieldBaseForParse.payload_._M_i & 4) == 0)
        break;
        goto LAB_00280215;
      case 9:
        CVar4 = FieldDescriptor::cpp_string_type(this_00);
        if ((CVar4 != kView) && (CVar4 != kString)) {
          if (CVar4 != kCord) break;
          bVar1 = (&pFVar9->field_0x1)[lVar16];
          bVar12 = (bool)((bVar1 & 0x20) >> 5);
          if (0xbf < bVar1 == bVar12) {
            pcVar10 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar12,0xbf < bVar1,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          }
          if (pcVar10 != (Nonnull<const_char_*>)0x0) goto LAB_0028067c;
          if (((&pFVar9->field_0x1)[lVar16] & 0x20) == 0) {
            if (((&pFVar9->field_0x1)[lVar16] & 1) == 0) {
              (this_01->super_MapFieldBase).super_MapFieldBaseForParse.payload_._M_i = 0;
              (this_01->super_MapFieldBase).super_MapFieldBaseForParse.prototype_as_void_ =
                   (void *)0x0;
            }
            else {
              puVar7 = *(undefined8 **)((long)&pFVar9->field_20 + lVar16);
              src._M_str = (char *)*puVar7;
              src._M_len = puVar7[1];
              absl::lts_20250127::Cord::Cord((Cord *)this_01,src,kConstructorString);
            }
            if (local_58 != (ThreadSafeArena *)0x0) {
              cleanup = internal::cleanup::arena_destruct_object<absl::lts_20250127::Cord>;
LAB_0028040f:
              internal::ThreadSafeArena::AddCleanup(local_58,this_01,cleanup);
            }
          }
          else {
            internal::ShortSooRep::ShortSooRep((ShortSooRep *)this_01,(Arena *)local_58);
            if (local_58 != (ThreadSafeArena *)0x0) {
              cleanup = internal::cleanup::
                        arena_destruct_object<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>
              ;
              goto LAB_0028040f;
            }
          }
          break;
        }
        bVar1 = (&pFVar9->field_0x1)[lVar16];
        bVar12 = (bool)((bVar1 & 0x20) >> 5);
        if (0xbf < bVar1 == bVar12) {
          pcVar10 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                              (bVar12,0xbf < bVar1,
                               "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        }
        if (pcVar10 != (Nonnull<const_char_*>)0x0) goto LAB_0028066f;
        if (((&pFVar9->field_0x1)[lVar16] & 0x20) != 0) {
LAB_00280350:
          (this_01->super_MapFieldBase).super_MapFieldBaseForParse.payload_._M_i = 0;
          (this_01->super_MapFieldBase).super_MapFieldBaseForParse.prototype_as_void_ = (void *)0x0;
          *(ThreadSafeArena **)&this_01->map_ = local_58;
          break;
        }
        puVar7 = &internal::fixed_address_empty_string;
        goto LAB_0028017f;
      case 10:
        bVar1 = (&pFVar9->field_0x1)[lVar16];
        bVar12 = (bool)((bVar1 & 0x20) >> 5);
        if (0xbf < bVar1 == bVar12) {
          pcVar10 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                              (bVar12,0xbf < bVar1,
                               "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        }
        if (pcVar10 != (Nonnull<const_char_*>)0x0) {
          SharedCtor();
          goto LAB_00280607;
        }
        if (((&pFVar9->field_0x1)[lVar16] & 0x20) == 0) {
          (this_01->super_MapFieldBase).super_MapFieldBaseForParse.payload_._M_i = 0;
        }
        else {
          if (((&pFVar9->type_)[lVar16] != '\v') ||
             (bVar12 = FieldDescriptor::is_map_message_type(this_00), !bVar12)) goto LAB_00280350;
          pDVar8 = FieldDescriptor::message_type(this_00);
          pFVar9 = Descriptor::map_value(pDVar8);
          local_50._24_8_ = FieldDescriptor::message_type(pFVar9);
          pDVar3 = this->type_info_->factory;
          pDVar8 = FieldDescriptor::message_type(this_00);
          if (local_50[0x14] == '\0') {
            default_entry = DynamicMessageFactory::GetPrototypeNoLock(pDVar3,pDVar8);
          }
          else {
            iVar13 = (*(pDVar3->super_MessageFactory)._vptr_MessageFactory[2])(pDVar3,pDVar8);
            default_entry = (Message *)CONCAT44(extraout_var,iVar13);
          }
          if ((Descriptor *)local_50._24_8_ == (Descriptor *)0x0) {
            mapped_default_entry_if_message = (Message *)0x0;
          }
          else {
            pDVar3 = this->type_info_->factory;
            if (local_50[0x14] == '\0') {
              mapped_default_entry_if_message =
                   DynamicMessageFactory::GetPrototypeNoLock(pDVar3,(Descriptor *)local_50._24_8_);
            }
            else {
              iVar13 = (*(pDVar3->super_MessageFactory)._vptr_MessageFactory[2])();
              mapped_default_entry_if_message = (Message *)CONCAT44(extraout_var_00,iVar13);
            }
          }
          internal::DynamicMapField::DynamicMapField
                    (this_01,default_entry,mapped_default_entry_if_message,(Arena *)local_58);
        }
      }
LAB_00280222:
      lVar5 = lVar5 + 1;
      lVar16 = lVar16 + 0x58;
      if (pDVar2->field_count_ <= lVar5) {
        return;
      }
    }
    if (((&pFVar9->field_0x1)[lVar16] & 0x10) == 0) {
      lVar14 = 0;
    }
    else {
      lVar14 = *(long *)((long)&pFVar9->scope_ + lVar16);
      if (lVar14 == 0) {
        internal::protobuf_assumption_failed
                  ("res != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb31);
      }
    }
    if (lVar14 == 0) {
      internal::protobuf_assumption_failed
                ("res != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb63);
    }
    if ((*(int *)(lVar14 + 4) != 1) || ((*(byte *)(*(long *)(lVar14 + 0x30) + 1) & 2) == 0)) {
      if (((&pFVar9->field_0x3)[lVar16] & 1) == 0) goto LAB_0027ffc2;
      goto LAB_00280222;
    }
    this = (DynamicMessage *)local_50;
    SharedCtor(this);
    pTVar11 = extraout_RAX;
LAB_002805b4:
    local_58 = *(ThreadSafeArena **)((ulong)local_58 & 0xfffffffffffffffe);
  } while( true );
}

Assistant:

void DynamicMessage::SharedCtor(bool lock_factory) {
  // We need to call constructors for various fields manually and set
  // default values where appropriate.  We use placement new to call
  // constructors.  If you haven't heard of placement new, I suggest Googling
  // it now.  We use placement new even for primitive types that don't have
  // constructors for consistency.  (In theory, placement new should be used
  // any time you are trying to convert untyped memory to typed memory, though
  // in practice that's not strictly necessary for types that don't have a
  // constructor.)

  const Descriptor* descriptor = type_info_->class_data.descriptor;
  Arena* arena = GetArena();
  // Initialize oneof cases.
  int oneof_count = 0;
  for (int i = 0; i < descriptor->real_oneof_decl_count(); ++i) {
    new (MutableOneofCaseRaw(oneof_count++)) uint32_t{0};
  }

  if (type_info_->extensions_offset != -1) {
    new (MutableExtensionsRaw()) ExtensionSet(arena);
  }
  for (int i = 0; i < descriptor->field_count(); i++) {
    const FieldDescriptor* field = descriptor->field(i);
    void* field_ptr = MutableRaw(i);
    if (InRealOneof(field)) {
      continue;
    }
    switch (field->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE)                         \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                 \
    if (!field->is_repeated()) {                           \
      new (field_ptr) TYPE(field->default_value_##TYPE()); \
    } else {                                               \
      new (field_ptr) RepeatedField<TYPE>(arena);          \
    }                                                      \
    break;

      HANDLE_TYPE(INT32, int32_t);
      HANDLE_TYPE(INT64, int64_t);
      HANDLE_TYPE(UINT32, uint32_t);
      HANDLE_TYPE(UINT64, uint64_t);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_ENUM:
        if (!field->is_repeated()) {
          new (field_ptr) int{field->default_value_enum()->number()};
        } else {
          new (field_ptr) RepeatedField<int>(arena);
        }
        break;

      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->cpp_string_type()) {
          case FieldDescriptor::CppStringType::kCord:
            if (!field->is_repeated()) {
              if (field->has_default_value()) {
                new (field_ptr) absl::Cord(field->default_value_string());
              } else {
                new (field_ptr) absl::Cord;
              }
              if (arena != nullptr) {
                // Cord does not support arena so here we need to notify arena
                // to remove the data it allocated on the heap by calling its
                // destructor.
                arena->OwnDestructor(static_cast<absl::Cord*>(field_ptr));
              }
            } else {
              new (field_ptr) RepeatedField<absl::Cord>(arena);
              if (arena != nullptr) {
                // Needs to destroy Cord elements.
                arena->OwnDestructor(
                    static_cast<RepeatedField<absl::Cord>*>(field_ptr));
              }
            }
            break;
          case FieldDescriptor::CppStringType::kView:
            if (internal::EnableExperimentalMicroString() &&
                !field->is_repeated()) {
              auto* str = ::new (MutableRaw<MicroString>(i)) MicroString();
              if (field->has_default_value()) {
                // TODO: Use an unowned block instead.
                str->Set(field->default_value_string(), arena);
              }
              break;
            }
            [[fallthrough]];
          case FieldDescriptor::CppStringType::kString:
            if (!field->is_repeated()) {
              ArenaStringPtr* asp = new (field_ptr) ArenaStringPtr();
              asp->InitDefault();
            } else {
              new (field_ptr) RepeatedPtrField<std::string>(arena);
            }
            break;
        }
        break;

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        if (!field->is_repeated()) {
          new (field_ptr) Message*(nullptr);
        } else {
          if (IsMapFieldInApi(field)) {
            const auto* sub =
                field->message_type()->map_value()->message_type();
            // We need to lock in most cases to avoid data racing. Only not lock
            // when the constructor is called inside GetPrototype(), in which
            // case we have already locked the factory.
            new (field_ptr) DynamicMapField(
                lock_factory
                    ? type_info_->factory->GetPrototype(field->message_type())
                    : type_info_->factory->GetPrototypeNoLock(
                          field->message_type()),
                sub != nullptr
                    ? lock_factory
                          ? type_info_->factory->GetPrototype(sub)
                          : type_info_->factory->GetPrototypeNoLock(sub)
                    : nullptr,
                arena);
          } else {
            new (field_ptr) RepeatedPtrField<Message>(arena);
          }
        }
        break;
      }
    }
  }
}